

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::applyColScale(HighsSparseMatrix *this,HighsScale *scale)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  long in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iEl_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  bVar2 = isColwise(in_RDI);
  if (bVar2) {
    for (local_14 = 0; local_14 < in_RDI->num_col_; local_14 = local_14 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_14);
      for (local_18 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_14 + 1)), local_18 < *pvVar3;
          local_18 = local_18 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),
                            (long)local_14);
        dVar1 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_18);
        *pvVar5 = dVar1 * *pvVar5;
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < in_RDI->num_row_; local_1c = local_1c + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_1c);
      for (local_20 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_1c + 1)), local_20 < *pvVar3;
          local_20 = local_20 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_20);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),(long)*pvVar3
                           );
        dVar1 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_20);
        *pvVar5 = dVar1 * *pvVar5;
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::applyColScale(const HighsScale& scale) {
  assert(this->formatOk());
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        this->value_[iEl] *= scale.col[iCol];
    }
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        this->value_[iEl] *= scale.col[this->index_[iEl]];
    }
  }
}